

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,internalJSONNode *orig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  uint uVar3;
  pointer pcVar4;
  JSONNode JVar5;
  jsonChildren *pjVar6;
  JSONNode **ppJVar7;
  JSONNode *pJVar8;
  size_t sVar9;
  JSONNode local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  json_string *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  json_string *local_40;
  size_t local_38;
  
  this->_type = orig->_type;
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (orig->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar4,pcVar4 + (orig->_name)._M_string_length);
  this->_name_encoded = orig->_name_encoded;
  local_50 = &this->_string;
  local_58 = &(this->_string).field_2;
  (this->_string)._M_dataplus._M_p = (pointer)local_58;
  pcVar4 = (orig->_string)._M_dataplus._M_p;
  local_48 = paVar1;
  local_40 = &this->_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar4,pcVar4 + (orig->_string)._M_string_length);
  this->_string_encoded = orig->_string_encoded;
  this->_value = orig->_value;
  this->refcount = 1;
  this->fetched = orig->fetched;
  this->Children = (jsonChildren *)0x0;
  if ((this->_type & 0xfe) == 4) {
    pjVar6 = (jsonChildren *)operator_new(0x10);
    pjVar6->array = (JSONNode **)0x0;
    pjVar6->mysize = 0;
    pjVar6->mycapacity = 0;
    this->Children = pjVar6;
    uVar3 = orig->Children->mysize;
    if ((ulong)uVar3 != 0) {
      pjVar6->mycapacity = uVar3;
      local_38 = (ulong)uVar3 << 3;
      ppJVar7 = (JSONNode **)malloc(local_38);
      pjVar6->array = ppJVar7;
      sVar9 = 0;
      do {
        pjVar6 = this->Children;
        JSONNode::duplicate(&local_60);
        pJVar8 = JSONNode::newJSONNode(&local_60);
        jsonChildren::inc(pjVar6);
        JVar5.internal = local_60.internal;
        uVar3 = pjVar6->mysize;
        pjVar6->mysize = uVar3 + 1;
        pjVar6->array[uVar3] = pJVar8;
        if (local_60.internal != (internalJSONNode *)0x0) {
          psVar2 = &(local_60.internal)->refcount;
          *psVar2 = *psVar2 - 1;
          if (*psVar2 == 0) {
            ~internalJSONNode(local_60.internal);
            operator_delete(JVar5.internal);
          }
        }
        sVar9 = sVar9 + 8;
      } while (local_38 != sVar9);
    }
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const internalJSONNode & orig) json_nothrow :
    _type(orig._type), _name(orig._name), _name_encoded(orig._name_encoded),
    _string(orig._string), _string_encoded(orig._string_encoded), _value(orig._value)
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(orig.fetched)
    initializeComment(orig._comment)
    initializeChildren(0){


    LIBJSON_COPY_CTOR;
    if (isContainer()){
	   CHILDREN = jsonChildren::newChildren();
	   if (json_likely(!orig.CHILDREN -> empty())){
		  CHILDREN -> reserve(orig.CHILDREN -> size());
		  json_foreach(orig.CHILDREN, myrunner){
			 CHILDREN -> push_back(JSONNode::newJSONNode((*myrunner) -> duplicate()));
		  }
	   }
    }
    #ifdef JSON_MUTEX_CALLBACKS /*-> JSON_MUTEX_CALLBACKS */
	   _set_mutex(orig.mylock, false);
    #endif /*<- */
}